

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive.cpp
# Opt level: O3

void __thiscall
SerializeArchiveVectorWriter_WriteAnInt_Test::~SerializeArchiveVectorWriter_WriteAnInt_Test
          (SerializeArchiveVectorWriter_WriteAnInt_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (SerializeArchiveVectorWriter, WriteAnInt) {
    std::vector<std::uint8_t> bytes;
    bytes.reserve (sizeof (int));
    pstore::serialize::archive::vector_writer writer (bytes);
    writer.put (42);

    // Check that we wrote sizeof (int) bytes.
    auto begin = std::begin (writer);
    auto end = std::end (writer);

    using difference_type = std::iterator_traits<decltype (begin)>::difference_type;
    ASSERT_EQ (difference_type{sizeof (int)}, std::distance (begin, end));
    EXPECT_EQ (bytes.size (), writer.bytes_consumed ());
    EXPECT_EQ (bytes.size (), writer.bytes_produced ());

    // Now coax the value back out of the byte array that the vector_writer has accumulated.
    std::uint8_t content[sizeof (int)];
    std::copy (begin, end, content);
    int value;
    std::memcpy (&value, content, sizeof (value));
    EXPECT_EQ (42, value);
}